

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

ssize_t __thiscall
capnp::LocalRequest::send(LocalRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  undefined2 uVar1;
  undefined8 uVar2;
  long *plVar3;
  Disposer *pDVar4;
  Disposer *pDVar5;
  EventLoop *pEVar6;
  PromiseNode *pPVar7;
  LocalCallContext *pLVar8;
  PromiseNode *pPVar9;
  undefined4 uVar10;
  Event **ppEVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  EventLoop *pEVar15;
  Refcounted *refcounted;
  bool *pbVar16;
  undefined4 in_register_00000034;
  long lVar17;
  Own<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,_kj::_::Void,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>,_kj::_::PropagateException>_>
  OVar18;
  ForkedPromise<void> forked;
  VoidPromiseAndPipeline promiseAndPipeline;
  PromiseFulfillerPair<void> cancelPaf;
  undefined1 local_d8 [8];
  Disposer *local_d0;
  LocalCallContext *local_c8;
  EventLoop *pEStack_c0;
  EventLoop *local_b8;
  Own<kj::_::PromiseNode> local_b0;
  undefined1 local_a0 [8];
  LocalCallContext *local_98;
  Promise<void> local_90;
  undefined4 local_80;
  undefined4 uStack_7c;
  Event **ppEStack_78;
  undefined1 local_70 [16];
  Own<kj::_::PromiseNode> local_60 [2];
  undefined8 local_40;
  undefined8 local_38;
  
  lVar17 = CONCAT44(in_register_00000034,__fd);
  if (*(long *)(lVar17 + 0x10) != 0) {
    uVar2 = *(undefined8 *)(lVar17 + 0x18);
    uVar1 = *(undefined2 *)(lVar17 + 0x20);
    kj::newPromiseAndFulfiller<void>();
    (**(code **)(**(long **)(lVar17 + 0x30) + 0x20))(&local_80);
    pEVar15 = (EventLoop *)operator_new(0xa8);
    uVar10 = ppEStack_78._0_4_;
    uVar12 = ppEStack_78._4_4_;
    ppEStack_78 = (Event **)0x0;
    uVar13 = local_60[1].ptr._0_4_;
    uVar14 = local_60[1].ptr._4_4_;
    local_60[1].ptr = (PromiseNode *)0x0;
    pbVar16 = &pEVar15->running;
    *(undefined4 *)&pEVar15->head = 0;
    pEVar15->port = (EventPort *)&PTR_getParams_006426a8;
    *(undefined ***)&pEVar15->running = &PTR_disposeImpl_00642708;
    pEVar15->tail = *(Event ***)(lVar17 + 8);
    pEVar15->depthFirstInsertPoint = *(Event ***)(lVar17 + 0x10);
    *(undefined8 *)(lVar17 + 0x10) = 0;
    *(undefined1 *)&(pEVar15->daemons).disposer = 0;
    pEVar15[1].daemons.disposer = (Disposer *)0x0;
    pEVar15[1].daemons.ptr = (TaskSet *)0x0;
    pEVar15[2].port = (EventPort *)0x0;
    pEVar15[2].running = (bool)(undefined1)local_80;
    pEVar15[2].lastRunnableState = (bool)local_80._1_1_;
    *(undefined2 *)&pEVar15[2].field_0xa = local_80._2_2_;
    *(undefined4 *)&pEVar15[2].field_0xc = uStack_7c;
    *(undefined4 *)&pEVar15[2].head = uVar10;
    *(undefined4 *)((long)&pEVar15[2].head + 4) = uVar12;
    pEVar15[2].tail = (Event **)0x0;
    pEVar15[2].depthFirstInsertPoint = (Event **)0x0;
    *(undefined4 *)&pEVar15[2].daemons.disposer = local_60[1].disposer._0_4_;
    *(undefined4 *)((long)&pEVar15[2].daemons.disposer + 4) = local_60[1].disposer._4_4_;
    *(undefined4 *)&pEVar15[2].daemons.ptr = uVar13;
    *(undefined4 *)((long)&pEVar15[2].daemons.ptr + 4) = uVar14;
    *(undefined4 *)&pEVar15->head = 1;
    plVar3 = *(long **)(lVar17 + 0x30);
    *(undefined4 *)&pEVar15->head = 2;
    local_c8 = (LocalCallContext *)pbVar16;
    pEStack_c0 = pEVar15;
    (**(code **)(*plVar3 + 8))(&local_80,plVar3,uVar2,uVar1);
    pEVar6 = pEStack_c0;
    if (pEStack_c0 != (EventLoop *)0x0) {
      pEStack_c0 = (EventLoop *)0x0;
      (**(local_c8->super_CallContextHook)._vptr_CallContextHook)
                (local_c8,(_func_int *)
                          ((long)pEVar6->port[-2]._vptr_EventPort + (long)&pEVar6->port));
    }
    kj::Promise<void>::fork(&local_90);
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_a0);
    *(int *)&pEVar15->head = *(int *)&pEVar15->head + 1;
    local_40 = pbVar16;
    local_38 = pEVar15;
    kj::Promise<void>::attach<kj::Own<capnp::LocalCallContext>>
              ((Promise<void> *)local_d8,(Own<capnp::LocalCallContext> *)local_a0);
    kj::
    heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
              ((kj *)&local_c8,(Own<kj::_::PromiseNode> *)local_d8,
               (Own<kj::_::PromiseNode> *)(local_70 + 0x10));
    local_b0.disposer = (Disposer *)local_c8;
    local_b0.ptr = (PromiseNode *)pEStack_c0;
    kj::Promise<void>::detach<capnp::LocalRequest::send()::_lambda(kj::Exception&&)_1_>
              ((Promise<void> *)&local_b0,(anon_class_1_0_00000001_for_errorHandler *)&local_c8);
    pPVar7 = local_b0.ptr;
    if ((EventLoop *)local_b0.ptr != (EventLoop *)0x0) {
      local_b0.ptr = (PromiseNode *)0x0;
      (**((CallContextHook *)&(local_b0.disposer)->_vptr_Disposer)->_vptr_CallContextHook)
                (local_b0.disposer,
                 (_func_int *)
                 ((long)((EventPort *)pPVar7->_vptr_PromiseNode)[-2]._vptr_EventPort +
                 (long)&pPVar7->_vptr_PromiseNode));
    }
    pDVar4 = local_d0;
    if (local_d0 != (Disposer *)0x0) {
      local_d0 = (Disposer *)0x0;
      (***(_func_int ***)local_d8)
                (local_d8,pDVar4->_vptr_Disposer[-2] + (long)&pDVar4->_vptr_Disposer);
    }
    uVar2 = local_38;
    if ((Disposer *)local_38 != (Disposer *)0x0) {
      local_38 = (Disposer *)0x0;
      (*(code *)**(undefined8 **)local_40)
                (local_40,(char *)(uVar2 + (long)(*(_func_int ***)uVar2)[-2]));
    }
    pLVar8 = local_98;
    if (local_98 != (LocalCallContext *)0x0) {
      local_98 = (LocalCallContext *)0x0;
      (**(code **)*(_func_int **)local_a0)
                (local_a0,(pLVar8->super_CallContextHook)._vptr_CallContextHook[-2] +
                          (long)&(pLVar8->super_CallContextHook)._vptr_CallContextHook);
    }
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_d8);
    pEStack_c0 = (EventLoop *)pbVar16;
    local_b8 = pEVar15;
    OVar18 = kj::
             heap<kj::_::TransformPromiseNode<capnp::Response<capnp::AnyPointer>,kj::_::Void,kj::CaptureByMove<capnp::LocalRequest::send()::_lambda(kj::Own<capnp::LocalCallContext>&&)_1_,kj::Own<capnp::LocalCallContext>>,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,kj::CaptureByMove<capnp::LocalRequest::send()::_lambda(kj::Own<capnp::LocalCallContext>&&)_1_,kj::Own<capnp::LocalCallContext>>,kj::_::PropagateException>
                       (&local_b0,
                        (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>
                         *)local_d8,(PropagateException *)&local_c8);
    pPVar7 = local_b0.ptr;
    pDVar4 = local_b0.disposer;
    pEVar6 = local_b8;
    if (local_b8 != (EventLoop *)0x0) {
      local_b8 = (EventLoop *)0x0;
      (*(code *)pEStack_c0->port->_vptr_EventPort)
                (pEStack_c0,
                 (_func_int *)((long)pEVar6->port[-2]._vptr_EventPort + (long)&pEVar6->port),
                 OVar18.ptr);
    }
    pDVar5 = local_d0;
    if (local_d0 != (Disposer *)0x0) {
      local_d0 = (Disposer *)0x0;
      (***(_func_int ***)local_d8)
                (local_d8,pDVar5->_vptr_Disposer[-2] + (long)&pDVar5->_vptr_Disposer);
    }
    uVar2 = local_70._8_8_;
    pPVar9 = local_90.super_PromiseBase.node.ptr;
    local_70._8_8_ = (Disposer *)0x0;
    (this->super_RequestHook)._vptr_RequestHook = (_func_int **)pDVar4;
    (this->message).disposer = (Disposer *)pPVar7;
    (this->message).ptr = (MallocMessageBuilder *)local_70._0_8_;
    this->interfaceId = uVar2;
    *(undefined8 *)&this->methodId = 0;
    (this->client).disposer = (Disposer *)0x0;
    (this->client).ptr = (ClientHook *)0x0;
    if ((EventLoop *)local_90.super_PromiseBase.node.ptr != (EventLoop *)0x0) {
      local_90.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (***(_func_int ***)
          &((Maybe<kj::Exception> *)&(local_90.super_PromiseBase.node.disposer)->_vptr_Disposer)->
           ptr)(local_90.super_PromiseBase.node.disposer,
                (_func_int *)
                ((long)&pPVar9->_vptr_PromiseNode +
                (long)((EventPort *)pPVar9->_vptr_PromiseNode)[-2]._vptr_EventPort));
    }
    uVar2 = local_70._8_8_;
    if ((Disposer *)local_70._8_8_ != (Disposer *)0x0) {
      local_70._8_8_ = (Disposer *)0x0;
      (*(code *)**(undefined8 **)local_70._0_8_)(local_70._0_8_,(*(_func_int ***)uVar2)[-2] + uVar2)
      ;
    }
    ppEVar11 = ppEStack_78;
    if (ppEStack_78 != (Event **)0x0) {
      ppEStack_78 = (Event **)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_7c,local_80))
                ((undefined8 *)CONCAT44(uStack_7c,local_80),
                 (long)ppEVar11 + (long)(*ppEVar11)[-1].prev);
    }
    pPVar7 = local_60[1].ptr;
    if (local_60[1].ptr != (PromiseNode *)0x0) {
      local_60[1].ptr = (PromiseNode *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(local_60[1].disposer._4_4_,local_60[1].disposer._0_4_))
                ((undefined8 *)CONCAT44(local_60[1].disposer._4_4_,local_60[1].disposer._0_4_),
                 (char *)((long)pPVar7 + (long)(*(ForkBranchBase **)pPVar7)[-1].next));
    }
    pPVar7 = local_60[0].ptr;
    if ((ExceptionOrValue *)local_60[0].ptr != (ExceptionOrValue *)0x0) {
      local_60[0].ptr = (PromiseNode *)0x0;
      (**(local_60[0].disposer)->_vptr_Disposer)
                (local_60[0].disposer,(char *)((long)pPVar7 + *(long *)(*(long *)pPVar7 + -0x10)));
    }
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
            ((Fault *)(local_70 + 0x10),
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0xbe,FAILED,"message.get() != nullptr","\"Already called send() on this request.\"",
             (char (*) [39])"Already called send() on this request.");
  kj::_::Debug::Fault::fatal((Fault *)(local_70 + 0x10));
}

Assistant:

RemotePromise<AnyPointer> send() override {
    KJ_REQUIRE(message.get() != nullptr, "Already called send() on this request.");

    // For the lambda capture.
    uint64_t interfaceId = this->interfaceId;
    uint16_t methodId = this->methodId;

    auto cancelPaf = kj::newPromiseAndFulfiller<void>();

    auto context = kj::refcounted<LocalCallContext>(
        kj::mv(message), client->addRef(), kj::mv(cancelPaf.fulfiller));
    auto promiseAndPipeline = client->call(interfaceId, methodId, kj::addRef(*context));

    // We have to make sure the call is not canceled unless permitted.  We need to fork the promise
    // so that if the client drops their copy, the promise isn't necessarily canceled.
    auto forked = promiseAndPipeline.promise.fork();

    // We daemonize one branch, but only after joining it with the promise that fires if
    // cancellation is allowed.
    forked.addBranch()
        .attach(kj::addRef(*context))
        .exclusiveJoin(kj::mv(cancelPaf.promise))
        .detach([](kj::Exception&&) {});  // ignore exceptions

    // Now the other branch returns the response from the context.
    auto promise = forked.addBranch().then(kj::mvCapture(context,
        [](kj::Own<LocalCallContext>&& context) {
      context->getResults(MessageSize { 0, 0 });  // force response allocation
      return kj::mv(KJ_ASSERT_NONNULL(context->response));
    }));

    // We return the other branch.
    return RemotePromise<AnyPointer>(
        kj::mv(promise), AnyPointer::Pipeline(kj::mv(promiseAndPipeline.pipeline)));
  }